

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O1

void __thiscall
c4::yml::detail::stack<c4::yml::Parser::State,_16UL>::_mv
          (stack<c4::yml::Parser::State,_16UL> *this,stack<c4::yml::Parser::State,_16UL> *that)

{
  code *pcVar1;
  size_t sVar2;
  void *pvVar3;
  pfn_allocate p_Var4;
  pfn_error p_Var5;
  bool bVar6;
  stack<c4::yml::Parser::State,_16UL> *psVar7;
  
  if ((stack<c4::yml::Parser::State,_16UL> *)that->m_stack == that) {
    if (0x10 < that->m_capacity) {
      if ((s_error_flags & 1) != 0) {
        bVar6 = is_debugger_attached();
        if (bVar6) {
          pcVar1 = (code *)swi(3);
          (*pcVar1)();
          return;
        }
      }
      (*(code *)PTR_error_impl_00240518)
                ("check failed: that->m_capacity <= N",0x23,
                 (anonymous_namespace)::s_default_callbacks);
    }
    if (that->m_capacity < that->m_size) {
      if ((s_error_flags & 1) != 0) {
        bVar6 = is_debugger_attached();
        if (bVar6) {
          pcVar1 = (code *)swi(3);
          (*pcVar1)();
          return;
        }
      }
      (*(code *)PTR_error_impl_00240518)
                ("check failed: that->m_size <= that->m_capacity",0x2e,
                 (anonymous_namespace)::s_default_callbacks);
    }
    memcpy(this,that,that->m_size * 0x98);
    psVar7 = this;
  }
  else {
    if (that->m_capacity < 0x11) {
      if ((s_error_flags & 1) != 0) {
        bVar6 = is_debugger_attached();
        if (bVar6) {
          pcVar1 = (code *)swi(3);
          (*pcVar1)();
          return;
        }
      }
      (*(code *)PTR_error_impl_00240518)
                ("check failed: that->m_capacity > N",0x22,
                 (anonymous_namespace)::s_default_callbacks);
    }
    if (that->m_capacity < that->m_size) {
      if ((s_error_flags & 1) != 0) {
        bVar6 = is_debugger_attached();
        if (bVar6) {
          pcVar1 = (code *)swi(3);
          (*pcVar1)();
          return;
        }
      }
      (*(code *)PTR_error_impl_00240518)
                ("check failed: that->m_size <= that->m_capacity",0x2e,
                 (anonymous_namespace)::s_default_callbacks);
    }
    psVar7 = (stack<c4::yml::Parser::State,_16UL> *)that->m_stack;
  }
  this->m_stack = psVar7->m_buf;
  sVar2 = that->m_capacity;
  this->m_size = that->m_size;
  this->m_capacity = sVar2;
  pvVar3 = (that->m_callbacks).m_user_data;
  p_Var4 = (that->m_callbacks).m_allocate;
  p_Var5 = (that->m_callbacks).m_error;
  (this->m_callbacks).m_free = (that->m_callbacks).m_free;
  (this->m_callbacks).m_error = p_Var5;
  (this->m_callbacks).m_user_data = pvVar3;
  (this->m_callbacks).m_allocate = p_Var4;
  if ((stack<c4::yml::Parser::State,_16UL> *)that->m_stack == this) {
    if ((s_error_flags & 1) != 0) {
      bVar6 = is_debugger_attached();
      if (bVar6) {
        pcVar1 = (code *)swi(3);
        (*pcVar1)();
        return;
      }
    }
    (*(code *)PTR_error_impl_00240518)
              ("check failed: that->m_stack != m_buf",0x24,
               (anonymous_namespace)::s_default_callbacks);
  }
  that->m_stack = that->m_buf;
  that->m_capacity = 0x10;
  that->m_size = 0;
  return;
}

Assistant:

void stack<T, N>::_mv(stack * that)
{
    if(that->m_stack != that->m_buf)
    {
        RYML_ASSERT(that->m_capacity > N);
        RYML_ASSERT(that->m_size <= that->m_capacity);
        m_stack = that->m_stack;
    }
    else
    {
        RYML_ASSERT(that->m_capacity <= N);
        RYML_ASSERT(that->m_size <= that->m_capacity);
        memcpy(m_buf, that->m_buf, that->m_size * sizeof(T));
        m_stack = m_buf;
    }
    m_size = that->m_size;
    m_capacity = that->m_capacity;
    m_callbacks = that->m_callbacks;
    // make sure no deallocation happens on destruction
    RYML_ASSERT(that->m_stack != m_buf);
    that->m_stack = that->m_buf;
    that->m_capacity = N;
    that->m_size = 0;
}